

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O3

bool __thiscall S2Polygon::FindLoopNestingError(S2Polygon *this,S2Error *error)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  pointer puVar6;
  char *pcVar7;
  ulong uVar8;
  pointer puVar9;
  
  puVar9 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (uint)((ulong)((long)puVar6 - (long)puVar9) >> 3);
  if (0 < (int)uVar3) {
    uVar5 = 0;
    iVar4 = -1;
    do {
      iVar1 = *(int *)((long)puVar9[uVar5]._M_t.
                             super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t + 8);
      if ((iVar1 < 0) || (iVar4 + 1 < iVar1)) {
        S2Error::Init(error,POLYGON_INVALID_LOOP_DEPTH,"Loop %d: invalid loop depth (%d)");
        return true;
      }
      uVar5 = uVar5 + 1;
      iVar4 = iVar1;
    } while ((uVar3 & 0x7fffffff) != uVar5);
    if (0 < (int)uVar3) {
      uVar5 = 0;
      do {
        iVar4 = (int)((ulong)((long)puVar6 - (long)puVar9) >> 3);
        if (0 < iVar4) {
          iVar4 = GetLastDescendant(this,(int)uVar5);
          uVar8 = 0;
          do {
            if (uVar5 != uVar8) {
              bVar2 = S2Loop::ContainsNonCrossingBoundary
                                ((S2Loop *)
                                 puVar9[uVar5]._M_t.
                                 super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,
                                 (S2Loop *)
                                 puVar9[uVar8]._M_t.
                                 super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,
                                 false);
              if (((long)uVar8 <= (long)iVar4 && uVar5 < uVar8) != bVar2) {
                pcVar7 = "not ";
                if ((long)uVar8 <= (long)iVar4 && uVar5 < uVar8) {
                  pcVar7 = "";
                }
                S2Error::Init(error,POLYGON_INVALID_LOOP_NESTING,
                              "Invalid nesting: loop %d should %scontain loop %d",uVar5 & 0xffffffff
                              ,pcVar7,uVar8 & 0xffffffff);
                return true;
              }
              puVar9 = (this->loops_).
                       super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar6 = (this->loops_).
                       super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            }
            uVar8 = uVar8 + 1;
          } while ((long)uVar8 < (long)(int)((ulong)((long)puVar6 - (long)puVar9) >> 3));
          iVar4 = (int)((ulong)((long)puVar6 - (long)puVar9) >> 3);
        }
        uVar5 = uVar5 + 1;
      } while ((long)uVar5 < (long)iVar4);
      return false;
    }
  }
  return false;
}

Assistant:

bool S2Polygon::FindLoopNestingError(S2Error* error) const {
  // First check that the loop depths make sense.
  for (int last_depth = -1, i = 0; i < num_loops(); ++i) {
    int depth = loop(i)->depth();
    if (depth < 0 || depth > last_depth + 1) {
      error->Init(S2Error::POLYGON_INVALID_LOOP_DEPTH,
                  "Loop %d: invalid loop depth (%d)", i, depth);
      return true;
    }
    last_depth = depth;
  }
  // Then check that they correspond to the actual loop nesting.  This test
  // is quadratic in the number of loops but the cost per iteration is small.
  for (int i = 0; i < num_loops(); ++i) {
    int last = GetLastDescendant(i);
    for (int j = 0; j < num_loops(); ++j) {
      if (i == j) continue;
      bool nested = (j >= i + 1) && (j <= last);
      const bool reverse_b = false;
      if (loop(i)->ContainsNonCrossingBoundary(loop(j), reverse_b) != nested) {
        error->Init(S2Error::POLYGON_INVALID_LOOP_NESTING,
                    "Invalid nesting: loop %d should %scontain loop %d",
                    i, nested ? "" : "not ", j);
        return true;
      }
    }
  }
  return false;
}